

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkUnusedAddresses(LegacyScriptPubKeyMan *this,CScript *script)

{
  ConstevalFormatString<1U> wallet_fmt;
  ConstevalFormatString<1U> wallet_fmt_00;
  ConstevalFormatString<2U> wallet_fmt_01;
  ConstevalFormatString<1U> wallet_fmt_02;
  CKeyID seed_id;
  bool bVar1;
  reference pCVar2;
  iterator params;
  size_type sVar3;
  reference pvVar4;
  char (*in_RSI) [20];
  ScriptPubKeyMan *in_RDI;
  long in_FS_OFFSET;
  int64_t index;
  bool internal;
  CTxDestination *dest;
  value_type *type;
  unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
  *__range4;
  CKeyPool *keypool;
  vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *__range3;
  CKeyID *keyid;
  vector<CKeyID,_std::allocator<CKeyID>_> *__range1;
  vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  iterator it;
  const_iterator __end4;
  const_iterator __begin4;
  iterator __end3;
  iterator __begin3;
  const_iterator mi;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  CKeyMetadata meta;
  CKeyMetadata *in_stack_fffffffffffffcf8;
  unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
  *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd1b;
  int in_stack_fffffffffffffd1c;
  CKeyMetadata *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd2d;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  iterator in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  byte in_stack_fffffffffffffd3f;
  ScriptPubKeyMan *this_00;
  LegacyScriptPubKeyMan *this_01;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  char *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined1 local_1f0 [56];
  CKeyPool *local_1b8;
  CKeyPool *local_1b0;
  _Base_ptr local_190;
  _Base_ptr local_180;
  CKeyID *local_170;
  CKeyID *local_168;
  CKeyMetadata *local_138;
  unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
  *puStack_130;
  undefined4 local_128;
  CKeyMetadata *local_f0;
  unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
  *puStack_e8;
  undefined4 local_e0;
  byte local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (LegacyScriptPubKeyMan *)(in_RSI[4] + 8);
  this_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffcf8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd30._M_node,
             (char *)CONCAT17(in_stack_fffffffffffffd2f,
                              CONCAT16(in_stack_fffffffffffffd2e,
                                       CONCAT15(in_stack_fffffffffffffd2d,
                                                CONCAT14(in_stack_fffffffffffffd2c,
                                                         in_stack_fffffffffffffd28)))),
             (char *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
             (bool)in_stack_fffffffffffffd1b);
  std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::vector
            ((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
             in_stack_fffffffffffffcf8);
  GetAffectedKeys((CScript *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                  (SigningProvider *)in_stack_fffffffffffffd30._M_node);
  local_168 = (CKeyID *)
              std::vector<CKeyID,_std::allocator<CKeyID>_>::begin
                        ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffd00);
  local_170 = (CKeyID *)
              std::vector<CKeyID,_std::allocator<CKeyID>_>::end
                        ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffd00);
  while (bVar1 = __gnu_cxx::operator==<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                           ((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                            (__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>
                             *)in_stack_fffffffffffffd00), ((bVar1 ^ 0xffU) & 1) != 0) {
    pCVar2 = __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
             operator*((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *
                       )in_stack_fffffffffffffcf8);
    params = std::
             map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
             find((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                   *)in_stack_fffffffffffffd00,(key_type *)in_stack_fffffffffffffcf8);
    local_180 = params._M_node;
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_long>_>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_long>_> *)in_stack_fffffffffffffcf8,
               (iterator *)0x3f2f71);
    local_190 = (_Base_ptr)
                std::
                map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                ::end((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                       *)in_stack_fffffffffffffd00);
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_long>_>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_long>_> *)in_stack_fffffffffffffcf8,
               (iterator *)0x3f2f9f);
    bVar1 = std::operator==((_Self *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                            (_Self *)in_stack_fffffffffffffd00);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffdc0 =
           "%s: Detected a used keypool key, mark all keypool keys up to this key as used\n";
      wallet_fmt.fmt._7_1_ = in_stack_fffffffffffffd7f;
      wallet_fmt.fmt._0_7_ = in_stack_fffffffffffffd78;
      ScriptPubKeyMan::WalletLogPrintf<char[20]>(in_RDI,wallet_fmt,(char (*) [20])params._M_node);
      std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_long>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_long>_> *)
                 in_stack_fffffffffffffcf8);
      MarkReserveKeysAsUsed
                ((LegacyScriptPubKeyMan *)in_stack_fffffffffffffd90,
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      local_1b0 = (CKeyPool *)
                  std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::begin
                            ((vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)
                             in_stack_fffffffffffffd00);
      local_1b8 = (CKeyPool *)
                  std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::end
                            ((vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)
                             in_stack_fffffffffffffd00);
      while (bVar1 = __gnu_cxx::
                     operator==<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
                               ((__normal_iterator<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                (__normal_iterator<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
                                 *)in_stack_fffffffffffffd00), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
        ::operator*((__normal_iterator<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
                     *)in_stack_fffffffffffffcf8);
        local_1f0._48_8_ =
             std::
             unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
             ::begin(in_stack_fffffffffffffd00);
        local_1f0._40_8_ =
             std::
             unordered_set<OutputType,_std::hash<OutputType>,_std::equal_to<OutputType>,_std::allocator<OutputType>_>
             ::end(in_stack_fffffffffffffd00);
        while (bVar1 = std::__detail::operator==
                                 ((_Node_iterator_base<OutputType,_false> *)
                                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                  (_Node_iterator_base<OutputType,_false> *)
                                  in_stack_fffffffffffffd00), ((bVar1 ^ 0xffU) & 1) != 0) {
          std::__detail::_Node_const_iterator<OutputType,_true,_false>::operator*
                    ((_Node_const_iterator<OutputType,_true,_false> *)in_stack_fffffffffffffcf8);
          GetDestinationForKey
                    ((CPubKey *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                     (OutputType)((ulong)in_stack_fffffffffffffd30._M_node >> 0x20));
          in_stack_fffffffffffffd98 = local_58;
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffffcf8,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)0x3f3168);
          std::optional<bool>::optional<const_bool_&,_true>
                    ((optional<bool> *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                     ,(bool *)in_stack_fffffffffffffd00);
          std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
          push_back((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *
                    )in_stack_fffffffffffffcf8,(value_type *)0x3f3195);
          WalletDestination::~WalletDestination((WalletDestination *)in_stack_fffffffffffffcf8);
          std::
          variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      *)in_stack_fffffffffffffcf8);
          std::__detail::_Node_const_iterator<OutputType,_true,_false>::operator++
                    ((_Node_const_iterator<OutputType,_true,_false> *)in_stack_fffffffffffffcf8);
        }
        __gnu_cxx::
        __normal_iterator<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
        ::operator++((__normal_iterator<wallet::CKeyPool_*,_std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>_>
                      *)in_stack_fffffffffffffcf8);
      }
      in_stack_fffffffffffffdd0 = 4;
      std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::~vector
                ((vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      in_stack_fffffffffffffd3f = (**(code **)(*(long *)*in_RSI + 0x48))(in_RSI,0);
      if ((in_stack_fffffffffffffd3f & 1) == 0) {
        in_stack_fffffffffffffd90 = "%s: Topping up keypool failed (locked wallet)\n";
        wallet_fmt_00.fmt._7_1_ = in_stack_fffffffffffffd7f;
        wallet_fmt_00.fmt._0_7_ = in_stack_fffffffffffffd78;
        ScriptPubKeyMan::WalletLogPrintf<char[20]>
                  (in_RDI,wallet_fmt_00,(char (*) [20])params._M_node);
      }
    }
    in_stack_fffffffffffffd30 =
         std::
         map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
         ::find((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 *)in_stack_fffffffffffffd00,(key_type *)in_stack_fffffffffffffcf8);
    local_1f0._32_8_ = in_stack_fffffffffffffd30;
    local_1f0._24_8_ =
         std::
         map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
         ::end((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                *)in_stack_fffffffffffffd00);
    bVar1 = std::operator==((_Self *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                            (_Self *)in_stack_fffffffffffffd00);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_> *)
                 in_stack_fffffffffffffcf8);
      CKeyMetadata::CKeyMetadata
                ((CKeyMetadata *)
                 CONCAT17(in_stack_fffffffffffffd2f,
                          CONCAT16(in_stack_fffffffffffffd2e,
                                   CONCAT15(in_stack_fffffffffffffd2d,
                                            CONCAT14(in_stack_fffffffffffffd2c,
                                                     in_stack_fffffffffffffd28)))),
                 in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd2f =
           base_blob<160U>::IsNull
                     ((base_blob<160U> *)
                      CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      if ((!(bool)in_stack_fffffffffffffd2f) &&
         (in_stack_fffffffffffffd2e =
               ::operator!=((base_blob<160U> *)
                            CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                            (base_blob<160U> *)in_stack_fffffffffffffd00),
         (bool)in_stack_fffffffffffffd2e)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf8)
        ;
        if ((local_b8 & 1) == 0) {
          in_stack_fffffffffffffd2d =
               ParseHDKeypath((string *)this_01,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          if (!(bool)in_stack_fffffffffffffd2d) {
            in_stack_fffffffffffffd88 =
                 "%s: Adding inactive seed keys failed, invalid hdKeypath: %s\n";
            wallet_fmt_01.fmt._7_1_ = in_stack_fffffffffffffd7f;
            wallet_fmt_01.fmt._0_7_ = in_stack_fffffffffffffd78;
            ScriptPubKeyMan::WalletLogPrintf<char[20],std::__cxx11::string>
                      (in_RDI,wallet_fmt_01,(char (*) [20])params._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
          }
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (in_stack_fffffffffffffd98,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffd90);
        }
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffffcf8);
        if (sVar3 == 3) {
          in_stack_fffffffffffffd20 = (CKeyMetadata *)local_1f0;
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                              (size_type)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd7f = (*pvVar4 & 0x7fffffff) != 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                     (size_type)in_stack_fffffffffffffd00);
          local_128 = local_e0;
          local_138 = local_f0;
          puStack_130 = puStack_e8;
          seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._8_8_ = pCVar2;
          seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ =
               in_stack_fffffffffffffdc0;
          seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] =
               (char)in_stack_fffffffffffffdd0;
          seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] =
               (char)((uint)in_stack_fffffffffffffdd0 >> 8);
          seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] =
               (char)((uint)in_stack_fffffffffffffdd0 >> 0x10);
          seed_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] =
               (char)((uint)in_stack_fffffffffffffdd0 >> 0x18);
          in_stack_fffffffffffffcf8 = local_f0;
          in_stack_fffffffffffffd00 = puStack_e8;
          in_stack_fffffffffffffd08 = local_e0;
          in_stack_fffffffffffffd2c =
               TopUpInactiveHDChain(this_01,seed_id,(int64_t)this_00,SUB81((ulong)in_RSI >> 0x38,0))
          ;
          if (!(bool)in_stack_fffffffffffffd2c) {
            wallet_fmt_02.fmt._7_1_ = in_stack_fffffffffffffd7f;
            wallet_fmt_02.fmt._0_7_ = in_stack_fffffffffffffd78;
            ScriptPubKeyMan::WalletLogPrintf<char[20]>
                      (in_RDI,wallet_fmt_02,(char (*) [20])params._M_node);
          }
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffcf8);
          ScriptPubKeyMan::WalletLogPrintf<char[20],unsigned_long,bool>
                    (this_00,(ConstevalFormatString<3U>)in_stack_fffffffffffffd88,in_RSI,
                     (unsigned_long *)in_RDI,(bool *)params._M_node);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      }
      CKeyMetadata::~CKeyMetadata(in_stack_fffffffffffffcf8);
    }
    __gnu_cxx::__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_>::
    operator++((__normal_iterator<CKeyID_*,_std::vector<CKeyID,_std::allocator<CKeyID>_>_> *)
               in_stack_fffffffffffffcf8);
  }
  std::vector<CKeyID,_std::allocator<CKeyID>_>::~vector
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDestination> LegacyScriptPubKeyMan::MarkUnusedAddresses(const CScript& script)
{
    LOCK(cs_KeyStore);
    std::vector<WalletDestination> result;
    // extract addresses and check if they match with an unused keypool key
    for (const auto& keyid : GetAffectedKeys(script, *this)) {
        std::map<CKeyID, int64_t>::const_iterator mi = m_pool_key_to_index.find(keyid);
        if (mi != m_pool_key_to_index.end()) {
            WalletLogPrintf("%s: Detected a used keypool key, mark all keypool keys up to this key as used\n", __func__);
            for (const auto& keypool : MarkReserveKeysAsUsed(mi->second)) {
                // derive all possible destinations as any of them could have been used
                for (const auto& type : LEGACY_OUTPUT_TYPES) {
                    const auto& dest = GetDestinationForKey(keypool.vchPubKey, type);
                    result.push_back({dest, keypool.fInternal});
                }
            }

            if (!TopUp()) {
                WalletLogPrintf("%s: Topping up keypool failed (locked wallet)\n", __func__);
            }
        }

        // Find the key's metadata and check if it's seed id (if it has one) is inactive, i.e. it is not the current m_hd_chain seed id.
        // If so, TopUp the inactive hd chain
        auto it = mapKeyMetadata.find(keyid);
        if (it != mapKeyMetadata.end()){
            CKeyMetadata meta = it->second;
            if (!meta.hd_seed_id.IsNull() && meta.hd_seed_id != m_hd_chain.seed_id) {
                std::vector<uint32_t> path;
                if (meta.has_key_origin) {
                    path = meta.key_origin.path;
                } else if (!ParseHDKeypath(meta.hdKeypath, path)) {
                    WalletLogPrintf("%s: Adding inactive seed keys failed, invalid hdKeypath: %s\n",
                                    __func__,
                                    meta.hdKeypath);
                }
                if (path.size() != 3) {
                    WalletLogPrintf("%s: Adding inactive seed keys failed, invalid path size: %d, has_key_origin: %s\n",
                                    __func__,
                                    path.size(),
                                    meta.has_key_origin);
                } else {
                    bool internal = (path[1] & ~BIP32_HARDENED_KEY_LIMIT) != 0;
                    int64_t index = path[2] & ~BIP32_HARDENED_KEY_LIMIT;

                    if (!TopUpInactiveHDChain(meta.hd_seed_id, index, internal)) {
                        WalletLogPrintf("%s: Adding inactive seed keys failed\n", __func__);
                    }
                }
            }
        }
    }

    return result;
}